

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prime.cpp
# Opt level: O2

int is_prime(int x)

{
  int i;
  uint uVar1;
  uint uVar2;
  double dVar3;
  double dVar4;
  
  if (x < 2) {
    return -1;
  }
  if ((uint)x < 4) {
    uVar1 = 1;
  }
  else {
    uVar1 = 0;
    if ((x & 1U) != 0) {
      dVar3 = floor(SQRT((double)x));
      uVar1 = 3;
      do {
        dVar4 = (double)(int)uVar1;
        if (dVar3 < dVar4) break;
        uVar2 = (uint)x % uVar1;
        uVar1 = uVar1 + 2;
      } while (uVar2 != 0);
      uVar1 = (uint)(dVar3 < dVar4);
    }
  }
  return uVar1;
}

Assistant:

int is_prime(const int x) {
    if (x < 2) {
        return -1;
    }

    if (x < 4) {
        return 1;
    }

    if (x % 2 == 0) {
        return 0;
    }

    for (int i = 3; i <= floor(sqrt((double) x)); i += 2) {
        if ((x % i) == 0) {
            return 0;
        }
    }

    return 1;
}